

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O1

void __thiscall
wasm::Precompute::reuseConstantNode<wasm::Break>(Precompute *this,Break *curr,Flow *flow)

{
  char **this_00;
  Const *this_01;
  RefFunc *this_02;
  bool bVar1;
  HeapTypeKind HVar2;
  long lVar3;
  Literal *other;
  Function *pFVar4;
  Expression *pEVar5;
  string_view name;
  HeapType local_48;
  undefined1 local_40 [8];
  Literal singleValue;
  
  lVar3 = ((long)(flow->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(flow->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
          (flow->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed;
  if (lVar3 == 0) {
    pEVar5 = (Expression *)0x0;
  }
  else {
    if ((lVar3 == 1) && (curr->value != (Expression *)0x0)) {
      other = Flow::getSingleValue(flow);
      Literal::Literal((Literal *)local_40,other);
      if (singleValue.field_0.func.super_IString.str._M_str + -2 < (char *)0x5) {
        this_01 = (Const *)curr->value;
        if ((this_01->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id ==
            ConstId) {
          Literal::operator=(&this_01->value,(Literal *)local_40);
          Const::finalize(this_01);
          Break::finalize(curr);
LAB_00a22956:
          Literal::~Literal((Literal *)local_40);
          return;
        }
      }
      else {
        this_00 = &singleValue.field_0.func.super_IString.str._M_str;
        bVar1 = wasm::Type::isNull((Type *)this_00);
        if (bVar1) {
          if ((((SpecificExpression<(wasm::Expression::Id)41> *)&curr->value->_id)->super_Expression
              )._id == RefNullId) {
            RefNull::finalize((RefNull *)curr->value,
                              (Type)singleValue.field_0.gcData.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi);
            Break::finalize(curr);
            goto LAB_00a22956;
          }
        }
        else if (((ulong)singleValue.field_0.func.super_IString.str._M_str & 1) == 0 &&
                 (char *)0x6 < singleValue.field_0.func.super_IString.str._M_str) {
          local_48 = wasm::Type::getHeapType((Type *)this_00);
          HVar2 = HeapType::getKind(&local_48);
          if ((HVar2 == Func) &&
             (this_02 = (RefFunc *)curr->value,
             (this_02->super_SpecificExpression<(wasm::Expression::Id)43>).super_Expression._id ==
             RefFuncId)) {
            name = (string_view)Literal::getFunc((Literal *)local_40);
            (this_02->func).super_IString.str = name;
            pFVar4 = Module::getFunction((this->
                                         super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                                         ).
                                         super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                         .
                                         super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                                         .currModule,(Name)name);
            RefFunc::finalize(this_02,(HeapType)(pFVar4->type).id);
            Break::finalize(curr);
            goto LAB_00a22956;
          }
        }
      }
      Literal::~Literal((Literal *)local_40);
    }
    pEVar5 = Flow::getConstExpression
                       (flow,(this->
                             super_WalkerPass<wasm::PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>_>
                             ).
                             super_PostWalker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                             .
                             super_Walker<wasm::Precompute,_wasm::UnifiedExpressionVisitor<wasm::Precompute,_void>_>
                             .currModule);
  }
  curr->value = pEVar5;
  Break::finalize(curr);
  return;
}

Assistant:

void reuseConstantNode(T* curr, Flow flow) {
    if (flow.values.isConcrete()) {
      // reuse a const / ref.null / ref.func node if there is one
      if (curr->value && flow.values.size() == 1) {
        Literal singleValue = flow.getSingleValue();
        if (singleValue.type.isNumber()) {
          if (auto* c = curr->value->template dynCast<Const>()) {
            c->value = singleValue;
            c->finalize();
            curr->finalize();
            return;
          }
        } else if (singleValue.isNull()) {
          if (auto* n = curr->value->template dynCast<RefNull>()) {
            n->finalize(singleValue.type);
            curr->finalize();
            return;
          }
        } else if (singleValue.type.isRef() &&
                   singleValue.type.getHeapType().isSignature()) {
          if (auto* r = curr->value->template dynCast<RefFunc>()) {
            r->func = singleValue.getFunc();
            auto heapType = getModule()->getFunction(r->func)->type;
            r->finalize(heapType);
            curr->finalize();
            return;
          }
        }
      }
      curr->value = flow.getConstExpression(*getModule());
    } else {
      curr->value = nullptr;
    }
    curr->finalize();
  }